

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int var_to_scan_var(gen_ctx_t gen_ctx,MIR_reg_t var)

{
  ulong *puVar1;
  ulong uVar2;
  MIR_type_t MVar3;
  bool bVar4;
  
  if (*(int *)((long)&gen_ctx->ctx + 4) != 0) {
    puVar1 = *(ulong **)&gen_ctx->optimize_level;
    if (puVar1 == (ulong *)0x0) {
      var_to_scan_var_cold_2();
LAB_0016ae77:
      var_to_scan_var_cold_1();
      if (var < 0x22) {
        bVar4 = var < 0x10;
      }
      else {
        MVar3 = MIR_reg_type(gen_ctx->ctx,var - 0x21,(gen_ctx->curr_func_item->u).func);
        bVar4 = MVar3 == MIR_T_P || MVar3 < MIR_T_F;
      }
      return (int)bVar4;
    }
    uVar2 = (ulong)var;
    var = 0xffffffff;
    if (uVar2 < *puVar1) {
      if (puVar1[2] == 0) goto LAB_0016ae77;
      var = *(MIR_reg_t *)(puVar1[2] + uVar2 * 4);
    }
  }
  return var;
}

Assistant:

static int var_to_scan_var (gen_ctx_t gen_ctx, MIR_reg_t var) {
  if (scan_vars_num == 0) return (int) var;
  if (VARR_LENGTH (int, var_to_scan_var_map) <= var) return -1;
  return VARR_GET (int, var_to_scan_var_map, var);
}